

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall
Func::SetConstructorCache
          (Func *this,ProfileId profiledCallSiteId,JITTimeConstructorCache *constructorCache)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  JITTimeConstructorCache **ppJVar5;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  PVar3 = JITTimeFunctionBody::GetProfiledCallSiteCount(this_00);
  if (PVar3 <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b0,
                       "(profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount())",
                       "profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00429d9c;
    *puVar4 = 0;
  }
  if (constructorCache == (JITTimeConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b1,"(constructorCache != nullptr)","constructorCache != nullptr");
    if (!bVar2) goto LAB_00429d9c;
    *puVar4 = 0;
  }
  ppJVar5 = this->constructorCaches;
  if (ppJVar5 == (JITTimeConstructorCache **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b2,"(this->constructorCaches != nullptr)",
                       "this->constructorCaches != nullptr");
    if (!bVar2) goto LAB_00429d9c;
    *puVar4 = 0;
    ppJVar5 = this->constructorCaches;
  }
  if (ppJVar5[profiledCallSiteId] != (JITTimeConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x6b3,"(this->constructorCaches[profiledCallSiteId] == nullptr)",
                       "this->constructorCaches[profiledCallSiteId] == nullptr");
    if (!bVar2) {
LAB_00429d9c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    ppJVar5 = this->constructorCaches;
  }
  this->constructorCacheCount = this->constructorCacheCount + 1;
  ppJVar5[profiledCallSiteId] = constructorCache;
  return;
}

Assistant:

void Func::SetConstructorCache(const Js::ProfileId profiledCallSiteId, JITTimeConstructorCache* constructorCache)
{
    AssertOrFailFast(profiledCallSiteId < GetJITFunctionBody()->GetProfiledCallSiteCount());
    Assert(constructorCache != nullptr);
    Assert(this->constructorCaches != nullptr);
    Assert(this->constructorCaches[profiledCallSiteId] == nullptr);
    this->constructorCacheCount++;
    this->constructorCaches[profiledCallSiteId] = constructorCache;
}